

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

size_t __thiscall google::protobuf::EnumOptions::ByteSizeLong(EnumOptions *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  Rep *pRVar5;
  size_t sVar6;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *pRVar7;
  long lVar8;
  
  sVar4 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  this_00 = &(this->field_0)._impl_.uninterpreted_option_;
  pRVar7 = this_00;
  if ((*(byte *)((long)&this->field_0 + 0x20) & 1) != 0) {
    pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
    pRVar7 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar5->elements;
    if (((ulong)(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ & 1) != 0) {
      pRVar5 = internal::RepeatedPtrFieldBase::rep(&this_00->super_RepeatedPtrFieldBase);
      this_00 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)pRVar5->elements;
    }
  }
  lVar8 = sVar4 + (long)iVar1 * 2;
  iVar1 = *(int *)((long)&this->field_0 + 0x28);
  for (; pRVar7 != (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
                   (&(this_00->super_RepeatedPtrFieldBase).tagged_rep_or_elem_ + iVar1);
      pRVar7 = (RepeatedPtrField<google::protobuf::UninterpretedOption> *)
               &(pRVar7->super_RepeatedPtrFieldBase).current_size_) {
    sVar4 = UninterpretedOption::ByteSizeLong
                      ((UninterpretedOption *)
                       (pRVar7->super_RepeatedPtrFieldBase).tagged_rep_or_elem_);
    uVar3 = (uint)sVar4 | 1;
    iVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    lVar8 = lVar8 + sVar4 + (ulong)(iVar2 * 9 + 0x49U >> 6);
  }
  uVar3 = (this->field_0)._impl_._has_bits_.has_bits_[0];
  sVar4 = lVar8 + (ulong)(0xe994U >> ((byte)uVar3 & 0xe) & 3) * 2;
  if ((uVar3 & 1) != 0) {
    sVar6 = FeatureSet::ByteSizeLong((this->field_0)._impl_.features_);
    uVar3 = (uint)sVar6 | 1;
    iVar1 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> iVar1 == 0; iVar1 = iVar1 + -1) {
      }
    }
    sVar4 = sVar4 + sVar6 + (ulong)(iVar1 * 9 + 0x49U >> 6) + 1;
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar4,&(this->field_0)._impl_._cached_size_);
  return sVar4;
}

Assistant:

::size_t EnumOptions::ByteSizeLong() const {
  const EnumOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.EnumOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x0000000eu & cached_has_bits) * 2;
   {
    // optional .google.protobuf.FeatureSet features = 7;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}